

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

string * __thiscall
flatbuffers::python::PythonGenerator::ModuleFor<flatbuffers::StructDef>
          (string *__return_storage_ptr__,PythonGenerator *this,StructDef *def)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __type _Var1;
  string *filepath;
  string filename;
  char local_61;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((((this->super_BaseGenerator).parser_)->opts).one_file == false) {
    IdlNamer::NamespacedType_abi_cxx11_(__return_storage_ptr__,&this->namer_,&def->super_Definition)
    ;
  }
  else {
    filepath = &(def->super_Definition).file;
    StripExtension(&local_60,filepath);
    std::operator+(&local_40,&local_60,
                   &(((this->super_BaseGenerator).parser_)->opts).filename_suffix);
    std::__cxx11::string::~string((string *)&local_60);
    _Var1 = std::operator==(&((this->super_BaseGenerator).parser_)->file_being_parsed_,filepath);
    if (_Var1) {
      StripPath(&local_60,&local_40);
      std::operator+(__return_storage_ptr__,".",&local_60);
      std::__cxx11::string::~string((string *)&local_60);
    }
    else {
      std::operator+(__return_storage_ptr__,
                     &(((this->super_BaseGenerator).parser_)->opts).include_prefix,&local_40);
      __first._M_current = (__return_storage_ptr__->_M_dataplus)._M_p;
      local_60._M_dataplus._M_p._0_1_ = 0x2f;
      local_61 = '.';
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (__first,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(__first._M_current + __return_storage_ptr__->_M_string_length),
                 (char *)&local_60,&local_61);
    }
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ModuleFor(const T *def) const {
    if (!parser_.opts.one_file) {
      return namer_.NamespacedType(*def);
    }

    std::string filename =
        StripExtension(def->file) + parser_.opts.filename_suffix;
    if (parser_.file_being_parsed_ == def->file) {
      return "." + StripPath(filename);  // make it a "local" import
    }

    std::string module = parser_.opts.include_prefix + filename;
    std::replace(module.begin(), module.end(), '/', '.');
    return module;
  }